

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O0

void __thiscall nigel::IMC_Generator::printAssembly(IMC_Generator *this,CodeBase *base)

{
  bool bVar1;
  list<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
  *this_00;
  reference psVar2;
  element_type *peVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  double extraout_XMM0_Qa_13;
  double extraout_XMM0_Qa_14;
  double extraout_XMM0_Qa_15;
  double extraout_XMM0_Qa_16;
  double extraout_XMM0_Qa_17;
  double extraout_XMM0_Qa_18;
  double extraout_XMM0_Qa_19;
  double extraout_XMM0_Qa_20;
  double extraout_XMM0_Qa_21;
  double extraout_XMM0_Qa_22;
  double extraout_XMM0_Qa_23;
  double extraout_XMM0_Qa_24;
  double extraout_XMM0_Qa_25;
  double extraout_XMM0_Qa_26;
  double extraout_XMM0_Qa_27;
  double extraout_XMM0_Qa_28;
  double extraout_XMM0_Qa_29;
  double extraout_XMM0_Qa_30;
  double extraout_XMM0_Qa_31;
  double extraout_XMM0_Qa_32;
  double extraout_XMM0_Qa_33;
  double extraout_XMM0_Qa_34;
  double extraout_XMM0_Qa_35;
  double extraout_XMM0_Qa_36;
  double extraout_XMM0_Qa_37;
  double extraout_XMM0_Qa_38;
  allocator local_fe1;
  string local_fe0 [32];
  string local_fc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f80;
  string local_f60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f20;
  string local_f00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ec0;
  string local_ea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e40;
  shared_ptr<nigel::IM_Operator> local_e20;
  String local_e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  shared_ptr<nigel::IM_Operator> local_dd0;
  String local_dc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da0;
  shared_ptr<nigel::IM_Operator> local_d80;
  String local_d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  shared_ptr<nigel::IM_Operator> local_d30;
  String local_d20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d00;
  shared_ptr<nigel::IM_Operator> local_ce0;
  String local_cd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0;
  shared_ptr<nigel::IM_Operator> local_c90;
  String local_c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c60;
  shared_ptr<nigel::IM_Operator> local_c40;
  String local_c30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c10;
  shared_ptr<nigel::IM_Operator> local_bf0;
  String local_be0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc0;
  shared_ptr<nigel::IM_Operator> local_ba0;
  String local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70;
  shared_ptr<nigel::IM_Operator> local_b50;
  String local_b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  shared_ptr<nigel::IM_Operator> local_b00;
  String local_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  shared_ptr<nigel::IM_Operator> local_ab0;
  String local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  shared_ptr<nigel::IM_Operator> local_a60;
  String local_a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  shared_ptr<nigel::IM_Operator> local_a10;
  String local_a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0;
  shared_ptr<nigel::IM_Operator> local_9c0;
  String local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  shared_ptr<nigel::IM_Operator> local_970;
  String local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  shared_ptr<nigel::IM_Operator> local_920;
  String local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  shared_ptr<nigel::IM_Operator> local_8d0;
  String local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  shared_ptr<nigel::IM_Operator> local_880;
  String local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  shared_ptr<nigel::IM_Operator> local_830;
  String local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  shared_ptr<nigel::IM_Operator> local_7e0;
  String local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  shared_ptr<nigel::IM_Operator> local_770;
  String local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  shared_ptr<nigel::IM_Operator> local_720;
  String local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  shared_ptr<nigel::IM_Operator> local_6d0;
  String local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  shared_ptr<nigel::IM_Operator> local_680;
  String local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  shared_ptr<nigel::IM_Operator> local_630;
  String local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  shared_ptr<nigel::IM_Operator> local_5e0;
  String local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  shared_ptr<nigel::IM_Operator> local_590;
  String local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  shared_ptr<nigel::IM_Operator> local_540;
  String local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  shared_ptr<nigel::IM_Operator> local_4f0;
  String local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  shared_ptr<nigel::IM_Operator> local_4a0;
  String local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  shared_ptr<nigel::IM_Operator> local_450;
  String local_440;
  shared_ptr<nigel::IM_Operator> local_420;
  String local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  shared_ptr<nigel::IM_Operator> local_370;
  String local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  shared_ptr<nigel::IM_Operator> local_300;
  String local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  shared_ptr<nigel::IM_Operator> local_290;
  String local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  shared_ptr<nigel::IM_Operator> local_220;
  String local_210;
  shared_ptr<nigel::IM_Operator> local_1f0;
  String local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  shared_ptr<nigel::IM_Operator> local_160;
  String local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  shared_ptr<nigel::IM_Operator> local_110;
  String local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [8];
  String out;
  shared_ptr<nigel::IM_Command> c;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
  *__range1;
  string local_70 [8];
  String tabs;
  allocator local_39;
  string local_38 [32];
  CodeBase *local_18;
  CodeBase *base_local;
  IMC_Generator *this_local;
  
  local_18 = base;
  base_local = (CodeBase *)this;
  std::allocator<char>::allocator();
  dVar4 = (double)std::__cxx11::string::string(local_38,"__ASM__",&local_39);
  helper::log((helper *)local_38,dVar4);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",(allocator *)((long)&__range1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  this_00 = &local_18->imCommands;
  __end1 = std::__cxx11::
           list<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
           ::begin(this_00);
  c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__cxx11::
       list<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
       ::end(this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&c.
                                                  super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar1) {
    psVar2 = std::_List_iterator<std::shared_ptr<nigel::IM_Command>_>::operator*(&__end1);
    std::shared_ptr<nigel::IM_Command>::shared_ptr
              ((shared_ptr<nigel::IM_Command> *)((long)&out.field_2 + 8),psVar2);
    std::__cxx11::string::string(local_c0,local_70);
    peVar3 = std::__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(out.field_2._M_local_buf + 8));
    if (peVar3->type == operation) {
      peVar3 = std::__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(out.field_2._M_local_buf + 8));
      if (peVar3->operation == nop) {
        dVar4 = (double)std::__cxx11::string::operator+=(local_c0,"NOP");
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(out.field_2._M_local_buf + 8));
        if (peVar3->operation == clr_a) {
          dVar4 = (double)std::__cxx11::string::operator+=(local_c0,"CLR A");
        }
        else {
          peVar3 = std::
                   __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(out.field_2._M_local_buf + 8));
          if (peVar3->operation == clr_c) {
            dVar4 = (double)std::__cxx11::string::operator+=(local_c0,"CLR C");
          }
          else {
            peVar3 = std::
                     __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(out.field_2._M_local_buf + 8));
            if (peVar3->operation == mov_a_const) {
              peVar3 = std::
                       __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)(out.field_2._M_local_buf + 8));
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_110,&peVar3->op1);
              operatorToString_abi_cxx11_(&local_100,this,&local_110);
              std::operator+(&local_e0,"MOV A, ",&local_100);
              std::__cxx11::string::operator+=(local_c0,(string *)&local_e0);
              std::__cxx11::string::~string((string *)&local_e0);
              std::__cxx11::string::~string((string *)&local_100);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_110);
              dVar4 = extraout_XMM0_Qa;
            }
            else {
              peVar3 = std::
                       __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)(out.field_2._M_local_buf + 8));
              if (peVar3->operation == mov_a_adr) {
                peVar3 = std::
                         __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)(out.field_2._M_local_buf + 8));
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_160,&peVar3->op1);
                operatorToString_abi_cxx11_(&local_150,this,&local_160);
                std::operator+(&local_130,"MOV A, ",&local_150);
                std::__cxx11::string::operator+=(local_c0,(string *)&local_130);
                std::__cxx11::string::~string((string *)&local_130);
                std::__cxx11::string::~string((string *)&local_150);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_160);
                dVar4 = extraout_XMM0_Qa_00;
              }
              else {
                peVar3 = std::
                         __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)(out.field_2._M_local_buf + 8));
                if (peVar3->operation == mov_a_r0) {
                  dVar4 = (double)std::__cxx11::string::operator+=(local_c0,"MOV A, R0");
                }
                else {
                  peVar3 = std::
                           __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)(out.field_2._M_local_buf + 8));
                  if (peVar3->operation == mov_a_atr0) {
                    dVar4 = (double)std::__cxx11::string::operator+=(local_c0,"MOV A, @R0");
                  }
                  else {
                    peVar3 = std::
                             __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)(out.field_2._M_local_buf + 8));
                    if (peVar3->operation == mov_a_atr1) {
                      dVar4 = (double)std::__cxx11::string::operator+=(local_c0,"MOV A, @R1");
                    }
                    else {
                      peVar3 = std::
                               __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)(out.field_2._M_local_buf + 8));
                      if (peVar3->operation == mov_adr_const) {
                        peVar3 = std::
                                 __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                               *)(out.field_2._M_local_buf + 8));
                        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1f0,&peVar3->op1);
                        operatorToString_abi_cxx11_(&local_1e0,this,&local_1f0);
                        std::operator+(&local_1c0,"MOV ",&local_1e0);
                        std::operator+(&local_1a0,&local_1c0,", ");
                        peVar3 = std::
                                 __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                               *)(out.field_2._M_local_buf + 8));
                        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_220,&peVar3->op2);
                        operatorToString_abi_cxx11_(&local_210,this,&local_220);
                        std::operator+(&local_180,&local_1a0,&local_210);
                        std::__cxx11::string::operator+=(local_c0,(string *)&local_180);
                        std::__cxx11::string::~string((string *)&local_180);
                        std::__cxx11::string::~string((string *)&local_210);
                        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_220);
                        std::__cxx11::string::~string((string *)&local_1a0);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1f0);
                        dVar4 = extraout_XMM0_Qa_01;
                      }
                      else {
                        peVar3 = std::
                                 __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                               *)(out.field_2._M_local_buf + 8));
                        if (peVar3->operation == mov_adr_a) {
                          peVar3 = std::
                                   __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                 *)(out.field_2._M_local_buf + 8));
                          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_290,&peVar3->op1);
                          operatorToString_abi_cxx11_(&local_280,this,&local_290);
                          std::operator+(&local_260,"MOV ",&local_280);
                          std::operator+(&local_240,&local_260,", A");
                          std::__cxx11::string::operator+=(local_c0,(string *)&local_240);
                          std::__cxx11::string::~string((string *)&local_240);
                          std::__cxx11::string::~string((string *)&local_260);
                          std::__cxx11::string::~string((string *)&local_280);
                          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_290);
                          dVar4 = extraout_XMM0_Qa_02;
                        }
                        else {
                          peVar3 = std::
                                   __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                 *)(out.field_2._M_local_buf + 8));
                          if (peVar3->operation == mov_adr_r0) {
                            peVar3 = std::
                                     __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_300,&peVar3->op1)
                            ;
                            operatorToString_abi_cxx11_(&local_2f0,this,&local_300);
                            std::operator+(&local_2d0,"MOV ",&local_2f0);
                            std::operator+(&local_2b0,&local_2d0,", R0");
                            std::__cxx11::string::operator+=(local_c0,(string *)&local_2b0);
                            std::__cxx11::string::~string((string *)&local_2b0);
                            std::__cxx11::string::~string((string *)&local_2d0);
                            std::__cxx11::string::~string((string *)&local_2f0);
                            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_300);
                            dVar4 = extraout_XMM0_Qa_03;
                          }
                          else {
                            peVar3 = std::
                                     __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                            if (peVar3->operation == mov_adr_atr0) {
                              peVar3 = std::
                                       __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                              std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                        (&local_370,&peVar3->op1);
                              operatorToString_abi_cxx11_(&local_360,this,&local_370);
                              std::operator+(&local_340,"MOV ",&local_360);
                              std::operator+(&local_320,&local_340,", @R0");
                              std::__cxx11::string::operator+=(local_c0,(string *)&local_320);
                              std::__cxx11::string::~string((string *)&local_320);
                              std::__cxx11::string::~string((string *)&local_340);
                              std::__cxx11::string::~string((string *)&local_360);
                              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_370);
                              dVar4 = extraout_XMM0_Qa_04;
                            }
                            else {
                              peVar3 = std::
                                       __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                              if (peVar3->operation == mov_adr_adr) {
                                peVar3 = std::
                                         __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                          (&local_420,&peVar3->op1);
                                operatorToString_abi_cxx11_(&local_410,this,&local_420);
                                std::operator+(&local_3f0,"MOV ",&local_410);
                                std::operator+(&local_3d0,&local_3f0,", ");
                                peVar3 = std::
                                         __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                          (&local_450,&peVar3->op2);
                                operatorToString_abi_cxx11_(&local_440,this,&local_450);
                                std::operator+(&local_3b0,&local_3d0,&local_440);
                                std::operator+(&local_390,&local_3b0," ; r into l");
                                std::__cxx11::string::operator+=(local_c0,(string *)&local_390);
                                std::__cxx11::string::~string((string *)&local_390);
                                std::__cxx11::string::~string((string *)&local_3b0);
                                std::__cxx11::string::~string((string *)&local_440);
                                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_450);
                                std::__cxx11::string::~string((string *)&local_3d0);
                                std::__cxx11::string::~string((string *)&local_3f0);
                                std::__cxx11::string::~string((string *)&local_410);
                                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_420);
                                dVar4 = extraout_XMM0_Qa_05;
                              }
                              else {
                                peVar3 = std::
                                         __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                if (peVar3->operation == mov_r0_const) {
                                  peVar3 = std::
                                           __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                            (&local_4a0,&peVar3->op1);
                                  operatorToString_abi_cxx11_(&local_490,this,&local_4a0);
                                  std::operator+(&local_470,"MOV R0, ",&local_490);
                                  std::__cxx11::string::operator+=(local_c0,(string *)&local_470);
                                  std::__cxx11::string::~string((string *)&local_470);
                                  std::__cxx11::string::~string((string *)&local_490);
                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_4a0);
                                  dVar4 = extraout_XMM0_Qa_06;
                                }
                                else {
                                  peVar3 = std::
                                           __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                  if (peVar3->operation == mov_r0_a) {
                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                              (local_c0,"MOV R0, A");
                                  }
                                  else {
                                    peVar3 = std::
                                             __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                    if (peVar3->operation == mov_r0_adr) {
                                      peVar3 = std::
                                               __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                               ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                (&local_4f0,&peVar3->op1);
                                      operatorToString_abi_cxx11_(&local_4e0,this,&local_4f0);
                                      std::operator+(&local_4c0,"MOV R0, ",&local_4e0);
                                      std::__cxx11::string::operator+=
                                                (local_c0,(string *)&local_4c0);
                                      std::__cxx11::string::~string((string *)&local_4c0);
                                      std::__cxx11::string::~string((string *)&local_4e0);
                                      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_4f0);
                                      dVar4 = extraout_XMM0_Qa_07;
                                    }
                                    else {
                                      peVar3 = std::
                                               __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                               ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                      if (peVar3->operation == mov_r1_const) {
                                        peVar3 = std::
                                                 __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                 ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                  (&local_540,&peVar3->op1);
                                        operatorToString_abi_cxx11_(&local_530,this,&local_540);
                                        std::operator+(&local_510,"MOV R1, ",&local_530);
                                        std::__cxx11::string::operator+=
                                                  (local_c0,(string *)&local_510);
                                        std::__cxx11::string::~string((string *)&local_510);
                                        std::__cxx11::string::~string((string *)&local_530);
                                        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_540)
                                        ;
                                        dVar4 = extraout_XMM0_Qa_08;
                                      }
                                      else {
                                        peVar3 = std::
                                                 __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                 ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                        if (peVar3->operation == mov_r1_a) {
                                          dVar4 = (double)std::__cxx11::string::operator+=
                                                                    (local_c0,"MOV R1, A");
                                        }
                                        else {
                                          peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                          if (peVar3->operation == mov_r1_adr) {
                                            peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                            std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                      (&local_590,&peVar3->op1);
                                            operatorToString_abi_cxx11_(&local_580,this,&local_590);
                                            std::operator+(&local_560,"MOV R1, ",&local_580);
                                            std::__cxx11::string::operator+=
                                                      (local_c0,(string *)&local_560);
                                            std::__cxx11::string::~string((string *)&local_560);
                                            std::__cxx11::string::~string((string *)&local_580);
                                            std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                      (&local_590);
                                            dVar4 = extraout_XMM0_Qa_09;
                                          }
                                          else {
                                            peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                            if (peVar3->operation == mov_atr0_const) {
                                              peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                              std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                        (&local_5e0,&peVar3->op1);
                                              operatorToString_abi_cxx11_
                                                        (&local_5d0,this,&local_5e0);
                                              std::operator+(&local_5b0,"MOV @R0, ",&local_5d0);
                                              std::__cxx11::string::operator+=
                                                        (local_c0,(string *)&local_5b0);
                                              std::__cxx11::string::~string((string *)&local_5b0);
                                              std::__cxx11::string::~string((string *)&local_5d0);
                                              std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                        (&local_5e0);
                                              dVar4 = extraout_XMM0_Qa_10;
                                            }
                                            else {
                                              peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                              if (peVar3->operation == mov_atr0_a) {
                                                dVar4 = (double)std::__cxx11::string::operator+=
                                                                          (local_c0,"MOV @R0, A");
                                              }
                                              else {
                                                peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                if (peVar3->operation == mov_atr1_a) {
                                                  dVar4 = (double)std::__cxx11::string::operator+=
                                                                            (local_c0,"MOV @R1, A");
                                                }
                                                else {
                                                  peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == mov_atr0_adr) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_630,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_620,this,&local_630);
                                                  std::operator+(&local_600,"MOV @R0, ",&local_620);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_600);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_600);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_620);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_630);
                                                  dVar4 = extraout_XMM0_Qa_11;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == mov_dptr_const) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_680,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_670,this,&local_680);
                                                  std::operator+(&local_650,"MOV DPTR, ",&local_670)
                                                  ;
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_650);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_650);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_670);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_680);
                                                  dVar4 = extraout_XMM0_Qa_12;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == movx_a_dptr) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,
                                                  "MOVX A, @DPTR");
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == movx_dptr_a) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,
                                                  "MOVX @DPTR, A");
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == push_adr) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_6d0,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_6c0,this,&local_6d0);
                                                  std::operator+(&local_6a0,"PUSH ",&local_6c0);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_6a0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_6a0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_6c0);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_6d0);
                                                  dVar4 = extraout_XMM0_Qa_13;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == pop_adr) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_720,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_710,this,&local_720);
                                                  std::operator+(&local_6f0,"POP ",&local_710);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_6f0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_6f0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_710);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_720);
                                                  dVar4 = extraout_XMM0_Qa_14;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == xch_a_r0) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"XCH A, R0")
                                                    ;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == xch_a_r0) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"XCH R0, A")
                                                    ;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == xch_a_r1) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"XCH A, R1")
                                                    ;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == xch_a_r1) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"XCH R1, A")
                                                    ;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == xch_a_atr0) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"XCH A, @R0"
                                                                              );
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == xch_a_atr0) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"XCH @R0, A"
                                                                              );
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == xch_a_adr) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_770,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_760,this,&local_770);
                                                  std::operator+(&local_740,"XCH A, ",&local_760);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_740);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_740);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_760);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_770);
                                                  dVar4 = extraout_XMM0_Qa_15;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == xch_a_adr) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_7e0,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_7d0,this,&local_7e0);
                                                  std::operator+(&local_7b0,"XCH ",&local_7d0);
                                                  std::operator+(&local_790,&local_7b0,", A");
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_790);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_790);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_7b0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_7d0);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_7e0);
                                                  dVar4 = extraout_XMM0_Qa_16;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == add_a_const) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_830,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_820,this,&local_830);
                                                  std::operator+(&local_800,"ADD A, ",&local_820);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_800);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_800);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_820);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_830);
                                                  dVar4 = extraout_XMM0_Qa_17;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == add_a_adr) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_880,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_870,this,&local_880);
                                                  std::operator+(&local_850,"ADD A, ",&local_870);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_850);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_850);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_870);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_880);
                                                  dVar4 = extraout_XMM0_Qa_18;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == add_a_r0) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"ADD A, R0")
                                                    ;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == add_a_atr0) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"ADD A, @R0"
                                                                              );
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == sub_a_const) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_8d0,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_8c0,this,&local_8d0);
                                                  std::operator+(&local_8a0,"SUBB A, ",&local_8c0);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_8a0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_8a0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_8c0);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_8d0);
                                                  dVar4 = extraout_XMM0_Qa_19;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == sub_a_adr) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_920,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_910,this,&local_920);
                                                  std::operator+(&local_8f0,"SUBB A, ",&local_910);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_8f0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_8f0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_910);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_920);
                                                  dVar4 = extraout_XMM0_Qa_20;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == sub_a_r0) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"SUBB A, R0"
                                                                              );
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == sub_a_atr0) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,
                                                  "SUBB A, @R0");
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == mul_a_b) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"MUL AB");
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == div_a_b) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"DIV AB");
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == inc_a) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"INC A");
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == dec_a) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"DEC A");
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == rr_a) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"RR A");
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == rl_a) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"RL A");
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == and_a_const) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_970,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_960,this,&local_970);
                                                  std::operator+(&local_940,"ANL A, #",&local_960);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_940);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_940);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_960);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_970);
                                                  dVar4 = extraout_XMM0_Qa_21;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == and_a_adr) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_9c0,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_9b0,this,&local_9c0);
                                                  std::operator+(&local_990,"ANL A, ",&local_9b0);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_990);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_990);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_9b0);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_9c0);
                                                  dVar4 = extraout_XMM0_Qa_22;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == and_a_atr0) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"ANL A, @R0"
                                                                              );
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == or_a_const) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_a10,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_a00,this,&local_a10);
                                                  std::operator+(&local_9e0,"ORL A, ",&local_a00);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_9e0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_9e0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_a00);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_a10);
                                                  dVar4 = extraout_XMM0_Qa_23;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == or_a_adr) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_a60,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_a50,this,&local_a60);
                                                  std::operator+(&local_a30,"ORL A, ",&local_a50);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_a30);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_a30);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_a50);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_a60);
                                                  dVar4 = extraout_XMM0_Qa_24;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == or_a_atr0) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"ORL A, @R0"
                                                                              );
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == xor_a_const) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_ab0,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_aa0,this,&local_ab0);
                                                  std::operator+(&local_a80,"XRL A, ",&local_aa0);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_a80);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_a80);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_aa0);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_ab0);
                                                  dVar4 = extraout_XMM0_Qa_25;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == xor_a_adr) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_b00,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_af0,this,&local_b00);
                                                  std::operator+(&local_ad0,"XRL A, ",&local_af0);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_ad0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_ad0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_af0);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_b00);
                                                  dVar4 = extraout_XMM0_Qa_26;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == xor_a_atr0) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"XRL A, @R0"
                                                                              );
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == cpl_a) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"CPL A");
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == cpl_bit) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_b50,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_b40,this,&local_b50);
                                                  std::operator+(&local_b20,"CPL ",&local_b40);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_b20);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_b20);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_b40);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_b50);
                                                  dVar4 = extraout_XMM0_Qa_27;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == clr_bit) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_ba0,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_b90,this,&local_ba0);
                                                  std::operator+(&local_b70,"CLR ",&local_b90);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_b70);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_b70);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_b90);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_ba0);
                                                  dVar4 = extraout_XMM0_Qa_28;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == set_bit) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_bf0,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_be0,this,&local_bf0);
                                                  std::operator+(&local_bc0,"SETB ",&local_be0);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_bc0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_bc0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_be0);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_bf0);
                                                  dVar4 = extraout_XMM0_Qa_29;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == jmp_abs) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_c40,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_c30,this,&local_c40);
                                                  std::operator+(&local_c10,"LJMP ",&local_c30);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_c10);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_c10);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_c30);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_c40);
                                                  dVar4 = extraout_XMM0_Qa_30;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == jmp_rel) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_c90,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_c80,this,&local_c90);
                                                  std::operator+(&local_c60,"SJMP ",&local_c80);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_c60);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_c60);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_c80);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_c90);
                                                  dVar4 = extraout_XMM0_Qa_31;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == jmp_c_rel) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_ce0,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_cd0,this,&local_ce0);
                                                  std::operator+(&local_cb0,"JC ",&local_cd0);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_cb0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_cb0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_cd0);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_ce0);
                                                  dVar4 = extraout_XMM0_Qa_32;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == jmp_nc_rel) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_d30,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_d20,this,&local_d30);
                                                  std::operator+(&local_d00,"JNC ",&local_d20);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_d00);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_d00);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_d20);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_d30);
                                                  dVar4 = extraout_XMM0_Qa_33;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == jmp_z_rel) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_d80,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_d70,this,&local_d80);
                                                  std::operator+(&local_d50,"JZ ",&local_d70);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_d50);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_d50);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_d70);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_d80);
                                                  dVar4 = extraout_XMM0_Qa_34;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == jmp_nz_rel) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_dd0,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_dc0,this,&local_dd0);
                                                  std::operator+(&local_da0,"JNZ ",&local_dc0);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_da0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_da0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_dc0);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_dd0);
                                                  dVar4 = extraout_XMM0_Qa_35;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == call_abs) {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                                            (&local_e20,&peVar3->op1);
                                                  operatorToString_abi_cxx11_
                                                            (&local_e10,this,&local_e20);
                                                  std::operator+(&local_df0,"LCALL ",&local_e10);
                                                  std::__cxx11::string::operator+=
                                                            (local_c0,(string *)&local_df0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_df0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_e10);
                                                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                                            (&local_e20);
                                                  dVar4 = extraout_XMM0_Qa_36;
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == ret) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"RET");
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  if (peVar3->operation == reti) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,"RETI");
                                                  }
                                                  else {
                                                    peVar3 = std::
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator->((
                                                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)(out.field_2._M_local_buf + 8));
                                                  dVar4 = extraout_XMM0_Qa_37;
                                                  if (peVar3->operation == reti) {
                                                    dVar4 = (double)std::__cxx11::string::operator+=
                                                                              (local_c0,
                                                  "-!-UNKNOWN_COMMAND-!-");
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      peVar3 = std::__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(out.field_2._M_local_buf + 8));
      if (peVar3->type == blockBegin) {
        peVar3 = std::
                 __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(out.field_2._M_local_buf + 8));
        bVar1 = std::operator!=(&peVar3->symbol,"");
        if (bVar1) {
          peVar3 = std::
                   __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(out.field_2._M_local_buf + 8));
          std::operator+(&local_e40,&peVar3->symbol,", ");
          std::__cxx11::string::operator+=(local_c0,(string *)&local_e40);
          std::__cxx11::string::~string((string *)&local_e40);
        }
        peVar3 = std::
                 __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(out.field_2._M_local_buf + 8));
        std::__cxx11::to_string(&local_ea0,peVar3->id);
        std::operator+(&local_e80,"begin",&local_ea0);
        std::operator+(&local_e60,&local_e80,":");
        std::__cxx11::string::operator+=(local_c0,(string *)&local_e60);
        std::__cxx11::string::~string((string *)&local_e60);
        std::__cxx11::string::~string((string *)&local_e80);
        std::__cxx11::string::~string((string *)&local_ea0);
        dVar4 = (double)std::__cxx11::string::operator+=(local_70,'\t');
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(out.field_2._M_local_buf + 8));
        if (peVar3->type == blockEnd) {
          peVar3 = std::
                   __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(out.field_2._M_local_buf + 8));
          std::__cxx11::to_string(&local_f00,peVar3->id);
          std::operator+(&local_ee0,"end",&local_f00);
          std::operator+(&local_ec0,&local_ee0,":");
          std::__cxx11::string::operator+=(local_c0,(string *)&local_ec0);
          std::__cxx11::string::~string((string *)&local_ec0);
          std::__cxx11::string::~string((string *)&local_ee0);
          std::__cxx11::string::~string((string *)&local_f00);
          dVar4 = (double)std::__cxx11::string::pop_back();
        }
        else {
          peVar3 = std::
                   __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(out.field_2._M_local_buf + 8));
          if (peVar3->type == blockFinish) {
            peVar3 = std::
                     __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(out.field_2._M_local_buf + 8));
            std::__cxx11::to_string(&local_f60,peVar3->id);
            std::operator+(&local_f40,"finish",&local_f60);
            std::operator+(&local_f20,&local_f40,":");
            std::__cxx11::string::operator+=(local_c0,(string *)&local_f20);
            std::__cxx11::string::~string((string *)&local_f20);
            std::__cxx11::string::~string((string *)&local_f40);
            dVar4 = (double)std::__cxx11::string::~string((string *)&local_f60);
          }
          else {
            peVar3 = std::
                     __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(out.field_2._M_local_buf + 8));
            dVar4 = extraout_XMM0_Qa_38;
            if (peVar3->type == conditionEnd) {
              peVar3 = std::
                       __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)(out.field_2._M_local_buf + 8));
              std::__cxx11::to_string(&local_fc0,peVar3->id);
              std::operator+(&local_fa0,"true",&local_fc0);
              std::operator+(&local_f80,&local_fa0,":");
              std::__cxx11::string::operator+=(local_c0,(string *)&local_f80);
              std::__cxx11::string::~string((string *)&local_f80);
              std::__cxx11::string::~string((string *)&local_fa0);
              dVar4 = (double)std::__cxx11::string::~string((string *)&local_fc0);
            }
          }
        }
      }
    }
    helper::log((helper *)local_c0,dVar4);
    std::__cxx11::string::~string(local_c0);
    std::shared_ptr<nigel::IM_Command>::~shared_ptr
              ((shared_ptr<nigel::IM_Command> *)((long)&out.field_2 + 8));
    std::_List_iterator<std::shared_ptr<nigel::IM_Command>_>::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  dVar4 = (double)std::__cxx11::string::string(local_fe0,"__END__",&local_fe1);
  helper::log((helper *)local_fe0,dVar4);
  std::__cxx11::string::~string(local_fe0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fe1);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void IMC_Generator::printAssembly( CodeBase & base )
	{
		log( "__ASM__" );

		String tabs = "";

		for( auto c : base.imCommands )
		{//Print all commands
			String out = tabs;
			if( c->type == IM_Command::Type::operation )
			{
				if( c->operation == HexOp::nop )					out += "NOP";

				else if( c->operation == HexOp::clr_a )				out += "CLR A";
				else if( c->operation == HexOp::clr_c )				out += "CLR C";

				else if( c->operation == HexOp::mov_a_const )		out += "MOV A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_a_adr )			out += "MOV A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_a_r0 )			out += "MOV A, R0";
				else if( c->operation == HexOp::mov_a_atr0 )		out += "MOV A, @R0";
				else if( c->operation == HexOp::mov_a_atr1 )		out += "MOV A, @R1";
				else if( c->operation == HexOp::mov_adr_const )		out += "MOV " + operatorToString( c->op1 ) + ", " + operatorToString( c->op2 );
				else if( c->operation == HexOp::mov_adr_a )			out += "MOV " + operatorToString( c->op1 ) + ", A";
				else if( c->operation == HexOp::mov_adr_r0 )		out += "MOV " + operatorToString( c->op1 ) + ", R0";
				else if( c->operation == HexOp::mov_adr_atr0 )		out += "MOV " + operatorToString( c->op1 ) + ", @R0";
				else if( c->operation == HexOp::mov_adr_adr )		out += "MOV " + operatorToString( c->op1 ) + ", " + operatorToString( c->op2 ) + " ; r into l";
				else if( c->operation == HexOp::mov_r0_const )		out += "MOV R0, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_r0_a )			out += "MOV R0, A";
				else if( c->operation == HexOp::mov_r0_adr )		out += "MOV R0, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_r1_const )		out += "MOV R1, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_r1_a )			out += "MOV R1, A";
				else if( c->operation == HexOp::mov_r1_adr )		out += "MOV R1, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_atr0_const )	out += "MOV @R0, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_atr0_a )		out += "MOV @R0, A";
				else if( c->operation == HexOp::mov_atr1_a )		out += "MOV @R1, A";
				else if( c->operation == HexOp::mov_atr0_adr )		out += "MOV @R0, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_dptr_const )	out += "MOV DPTR, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::movx_a_dptr )		out += "MOVX A, @DPTR";
				else if( c->operation == HexOp::movx_dptr_a )		out += "MOVX @DPTR, A";

				else if( c->operation == HexOp::push_adr )			out += "PUSH " + operatorToString( c->op1 );
				else if( c->operation == HexOp::pop_adr )			out += "POP " + operatorToString( c->op1 );

				else if( c->operation == HexOp::xch_a_r0 )			out += "XCH A, R0";
				else if( c->operation == HexOp::xch_r0_a )			out += "XCH R0, A";
				else if( c->operation == HexOp::xch_a_r1 )			out += "XCH A, R1";
				else if( c->operation == HexOp::xch_r1_a )			out += "XCH R1, A";
				else if( c->operation == HexOp::xch_a_atr0 )		out += "XCH A, @R0";
				else if( c->operation == HexOp::xch_atr0_a )		out += "XCH @R0, A";
				else if( c->operation == HexOp::xch_a_adr )			out += "XCH A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::xch_adr_a )			out += "XCH " + operatorToString( c->op1 ) + ", A";

				else if( c->operation == HexOp::add_a_const )		out += "ADD A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::add_a_adr )			out += "ADD A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::add_a_r0 )			out += "ADD A, R0";
				else if( c->operation == HexOp::add_a_atr0 )		out += "ADD A, @R0";
				else if( c->operation == HexOp::sub_a_const )		out += "SUBB A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::sub_a_adr )			out += "SUBB A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::sub_a_r0 )			out += "SUBB A, R0";
				else if( c->operation == HexOp::sub_a_atr0 )		out += "SUBB A, @R0";
				else if( c->operation == HexOp::mul_a_b )			out += "MUL AB";
				else if( c->operation == HexOp::div_a_b )			out += "DIV AB";

				else if( c->operation == HexOp::inc_a )				out += "INC A";
				else if( c->operation == HexOp::dec_a )				out += "DEC A";
				else if( c->operation == HexOp::rr_a )				out += "RR A";
				else if( c->operation == HexOp::rl_a )				out += "RL A";

				else if( c->operation == HexOp::and_a_const )		out += "ANL A, #" + operatorToString( c->op1 );
				else if( c->operation == HexOp::and_a_adr )			out += "ANL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::and_a_atr0 )		out += "ANL A, @R0";
				else if( c->operation == HexOp::or_a_const )		out += "ORL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::or_a_adr )			out += "ORL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::or_a_atr0 )			out += "ORL A, @R0";
				else if( c->operation == HexOp::xor_a_const )		out += "XRL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::xor_a_adr )			out += "XRL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::xor_a_atr0 )		out += "XRL A, @R0";

				else if( c->operation == HexOp::cpl_a )				out += "CPL A";

				else if( c->operation == HexOp::cpl_bit )			out += "CPL " + operatorToString( c->op1 );
				else if( c->operation == HexOp::clr_bit )			out += "CLR " + operatorToString( c->op1 );
				else if( c->operation == HexOp::set_bit )			out += "SETB " + operatorToString( c->op1 );

				else if( c->operation == HexOp::jmp_abs )			out += "LJMP " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_rel )			out += "SJMP " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_c_rel )			out += "JC " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_nc_rel )		out += "JNC " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_z_rel )			out += "JZ " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_nz_rel )		out += "JNZ " + operatorToString( c->op1 );

				else if( c->operation == HexOp::call_abs )			out += "LCALL " + operatorToString( c->op1 );
				else if( c->operation == HexOp::ret )				out += "RET";
				else if( c->operation == HexOp::reti )				out += "RETI";

				else if( c->operation == HexOp::reti )				out += "-!-UNKNOWN_COMMAND-!-";
			}
			else if( c->type == IM_Command::Type::blockBegin )
			{
				if( c->symbol != "" ) out += c->symbol + ", ";
				out += "begin" + to_string( c->id ) + ":";
				tabs += '\t';
			}
			else if( c->type == IM_Command::Type::blockEnd )
			{
				out += "end" + to_string( c->id ) + ":";
				tabs.pop_back();
			}
			else if( c->type == IM_Command::Type::blockFinish )
			{
				out += "finish" + to_string( c->id ) + ":";
			}
			else if( c->type == IM_Command::Type::conditionEnd )
			{
				out += "true" + to_string( c->id ) + ":";
			}

			log( out );
		}

		log( "__END__" );
	}